

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xdr_inline.h
# Opt level: O2

bool_t xdr_uint16_t(XDR *__xdrs,uint16_t *__up)

{
  xdr_op xVar1;
  undefined4 uVar2;
  _Bool _Var3;
  char cVar4;
  caddr_t pcVar5;
  undefined7 extraout_var;
  ushort local_c [2];
  
  xVar1 = __xdrs[2].x_op;
  pcVar5 = (caddr_t)(ulong)xVar1;
  if (xVar1 != XDR_FREE) {
    if (xVar1 != XDR_DECODE) {
      if (xVar1 != XDR_ENCODE) {
        return 0;
      }
      _Var3 = xdr_putuint16((XDR *)__xdrs,(uint)*__up);
      return (bool_t)CONCAT71(extraout_var,_Var3);
    }
    pcVar5 = (caddr_t)(*(undefined4 **)&__xdrs->x_handy + 1);
    if (__xdrs[1].x_private < pcVar5) {
      cVar4 = (*(code *)**(undefined8 **)__xdrs)(__xdrs,local_c);
      if (cVar4 == '\0') {
        return 0;
      }
      pcVar5 = (caddr_t)(ulong)local_c[0];
      *__up = local_c[0];
    }
    else {
      uVar2 = **(undefined4 **)&__xdrs->x_handy;
      *__up = (ushort)(byte)((uint)uVar2 >> 0x18) | (ushort)((uint)uVar2 >> 8) & 0xff00;
      *(caddr_t *)&__xdrs->x_handy = pcVar5;
    }
  }
  return (bool_t)CONCAT71((int7)((ulong)pcVar5 >> 8),1);
}

Assistant:

static inline bool
xdr_uint16_t(XDR *xdrs, uint16_t *u_int16_p)
{
	switch (xdrs->x_op) {

	case XDR_ENCODE:
		return (XDR_PUTUINT16(xdrs, *u_int16_p));

	case XDR_DECODE:
		return (XDR_GETUINT16(xdrs, u_int16_p));

	case XDR_FREE:
		return (true);
	}
	/* NOTREACHED */
	return (false);
}